

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall helics::apps::Source::initialize(Source *this)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  TimeRepresentation<count_time<9,_long>_> TVar5;
  size_type sVar6;
  string *psVar7;
  long in_RDI;
  iterator fnd;
  SourceObject *src;
  iterator __end2;
  iterator __begin2;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *__range2;
  int ii;
  Modes md;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
  *in_stack_ffffffffffffff48;
  Interface *in_stack_ffffffffffffff50;
  _Self local_80 [2];
  _Self local_68;
  reference local_60;
  _Self local_58;
  _Self local_38;
  long local_18;
  int local_10;
  Modes local_9;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x409c85);
  local_9 = Federate::getCurrentMode((Federate *)0x409c94);
  if (local_9 == STARTUP) {
    local_10 = 0;
    local_18 = in_RDI + 0xa0;
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::begin
              (in_stack_ffffffffffffff48);
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::end
              (in_stack_ffffffffffffff48);
    while (bVar2 = CLI::std::operator==(&local_38,&local_58), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_60 = CLI::std::
                 _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                 ::operator*(&local_38);
      if (local_60->generatorIndex < 0) {
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x409d41)
        ;
        iVar1 = local_10;
        if (bVar2) {
          sVar6 = CLI::std::
                  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                  ::size((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                          *)(in_RDI + 0xf0));
          if (iVar1 < (int)sVar6) {
            local_60->generatorIndex = local_10;
          }
          else {
            local_60->generatorIndex = 0;
          }
        }
        else {
          join_0x00000010_0x00000000_ =
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff50);
          local_68._M_node =
               (_Base_ptr)
               CLI::std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
               ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                       *)in_stack_ffffffffffffff48,(key_type *)0x409d83);
          local_80[0]._M_node =
               (_Base_ptr)
               CLI::std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
               ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                      *)in_stack_ffffffffffffff48);
          bVar2 = CLI::std::operator==(&local_68,local_80);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"unable to link to signal generator ");
            poVar4 = std::operator<<(poVar4,(string *)&local_60->generatorName);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            TVar5 = TimeRepresentation<count_time<9,_long>_>::maxVal();
            (local_60->nextTime).internalTimeCode = TVar5.internalTimeCode;
            local_60->generatorIndex = 0;
          }
          else {
            ppVar3 = CLI::std::
                     _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                   *)0x409dbf);
            local_60->generatorIndex = ppVar3->second;
          }
        }
      }
      else {
        iVar1 = local_60->generatorIndex;
        sVar6 = CLI::std::
                vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                ::size((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                        *)(in_RDI + 0xf0));
        if ((int)sVar6 <= iVar1) {
          in_stack_ffffffffffffff50 =
               (Interface *)std::operator<<((ostream *)&std::cerr,"invalid generator index for ");
          psVar7 = Interface::getName_abi_cxx11_(in_stack_ffffffffffffff50);
          poVar4 = std::operator<<((ostream *)in_stack_ffffffffffffff50,(string *)psVar7);
          std::operator<<(poVar4,"disabling output\n");
          TVar5 = TimeRepresentation<count_time<9,_long>_>::maxVal();
          (local_60->nextTime).internalTimeCode = TVar5.internalTimeCode;
        }
      }
      CLI::std::
      _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
      ::operator++((_Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                    *)in_stack_ffffffffffffff50);
    }
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x409f2a);
    Federate::enterInitializingMode(local_80[2]._M_node);
  }
  return;
}

Assistant:

void Source::initialize()
    {
        auto md = fed->getCurrentMode();
        if (md != Federate::Modes::STARTUP) {
            return;
        }

        int ii = 0;
        for (auto& src : sources) {
            if (src.generatorIndex < 0) {
                if (!src.generatorName.empty()) {
                    auto fnd = generatorLookup.find(src.generatorName);
                    if (fnd != generatorLookup.end()) {
                        src.generatorIndex = fnd->second;
                    } else {
                        std::cout << "unable to link to signal generator " << src.generatorName
                                  << std::endl;
                        src.nextTime = Time::maxVal();
                        src.generatorIndex = 0;
                    }
                } else {
                    if (ii < static_cast<int>(generators.size())) {
                        src.generatorIndex = ii;
                    } else {
                        src.generatorIndex = 0;
                    }
                }
            } else {
                if (src.generatorIndex >= static_cast<int>(generators.size())) {
                    std::cerr << "invalid generator index for " << src.pub.getName()
                              << "disabling output\n";
                    src.nextTime = Time::maxVal();
                }
            }
        }

        fed->enterInitializingMode();
    }